

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help.hpp
# Opt level: O3

void __thiscall
pstore::command_line::help<std::basic_ostream<char,_std::char_traits<char>_>_>::usage
          (help<std::basic_ostream<char,_std::char_traits<char>_>_> *this)

{
  ostream *poVar1;
  _List_node_base *p_Var2;
  help<std::basic_ostream<char,_std::char_traits<char>_>_> *this_00;
  bool bVar3;
  int iVar4;
  undefined8 in_RAX;
  options_container *poVar5;
  string *psVar6;
  undefined8 uStack_38;
  
  poVar1 = this->outs_;
  uStack_38 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"USAGE: ",7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(this->program_name_)._M_dataplus._M_p,(this->program_name_)._M_string_length);
  poVar5 = option::all_abi_cxx11_();
  bVar3 = details::has_switches(&this->super_option,poVar5);
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>(this->outs_," [options]",10);
  }
  poVar5 = option::all_abi_cxx11_();
  for (p_Var2 = (poVar5->
                super__List_base<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>
                )._M_impl._M_node.super__List_node_base._M_next; p_Var2 != (_List_node_base *)poVar5
      ; p_Var2 = (((_List_base<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>
                    *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    this_00 = (help<std::basic_ostream<char,_std::char_traits<char>_>_> *)p_Var2[1]._M_next;
    if ((this_00 != this) &&
       (iVar4 = (*(this_00->super_option)._vptr_option[9])(this_00), (char)iVar4 != '\0')) {
      poVar1 = this->outs_;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      psVar6 = option::usage_abi_cxx11_((option *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length);
    }
  }
  uStack_38 = CONCAT17(10,(undefined7)uStack_38);
  std::__ostream_insert<char,std::char_traits<char>>(this->outs_,(char *)((long)&uStack_38 + 7),1);
  return;
}

Assistant:

void help<OutputStream>::usage () const {
            outs_ << ostream_traits::out_text ("USAGE: ")
                  << ostream_traits::out_string (program_name_);
            if (this->has_switches ()) {
                outs_ << ostream_traits::out_text (" [options]");
            }
            for (option const * const op : option::all ()) {
                if (op != this && op->is_positional ()) {
                    outs_ << ostream_traits::out_text (" ")
                          << ostream_traits::out_string (op->usage ());
                }
            }
            outs_ << '\n';
        }